

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

void __thiscall duckdb::AsOfGlobalSinkState::~AsOfGlobalSinkState(AsOfGlobalSinkState *this)

{
  _Head_base<0UL,_duckdb::PartitionGlobalSinkState_*,_false> _Var1;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__AsOfGlobalSinkState_0249e488;
  ::std::
  vector<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
  ::~vector(&(this->lhs_buffers).
             super_vector<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
           );
  _Var1._M_head_impl =
       (this->lhs_sink).
       super_unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionGlobalSinkState_*,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::PartitionGlobalSinkState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (PartitionGlobalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_PartitionGlobalSinkState + 8))();
  }
  (this->lhs_sink).
  super_unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalSinkState_*,_std::default_delete<duckdb::PartitionGlobalSinkState>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalSinkState_*,_false>._M_head_impl =
       (PartitionGlobalSinkState *)0x0;
  ::std::vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>::~vector
            (&(this->right_outers).
              super_vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>);
  PartitionGlobalSinkState::~PartitionGlobalSinkState(&this->rhs_sink);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

AsOfGlobalSinkState(ClientContext &context, const PhysicalAsOfJoin &op)
	    : rhs_sink(context, op.rhs_partitions, op.rhs_orders, op.children[1].get().GetTypes(), {},
	               op.estimated_cardinality),
	      is_outer(IsRightOuterJoin(op.join_type)), has_null(false) {
	}